

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O1

void XXH128(void *input,size_t len,unsigned_long_long seed,void *out)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (len < 0x20) {
    uVar6 = seed + 0x27d4eb2f165667c5;
    uVar9 = seed + 0x9e3779b185ebca87;
    switch((uint)len & 0x1f) {
    case 0:
      goto switchD_001436e7_caseD_0;
    case 2:
      goto switchD_001436e7_caseD_2;
    case 3:
      goto switchD_001436e7_caseD_3;
    case 4:
      goto switchD_001436e7_caseD_4;
    case 5:
      goto switchD_001436e7_caseD_5;
    case 6:
      goto switchD_001436e7_caseD_6;
    case 7:
      goto switchD_001436e7_caseD_7;
    case 8:
      goto switchD_001436e7_caseD_8;
    case 9:
      goto switchD_001436e7_caseD_9;
    case 10:
      goto switchD_001436e7_caseD_a;
    case 0xb:
      goto switchD_001436e7_caseD_b;
    case 0xc:
      goto switchD_001436e7_caseD_c;
    case 0xd:
      goto switchD_001436e7_caseD_d;
    case 0xe:
      goto switchD_001436e7_caseD_e;
    case 0xf:
      goto switchD_001436e7_caseD_f;
    case 0x10:
      goto switchD_001436e7_caseD_10;
    case 0x11:
      goto switchD_001436e7_caseD_11;
    case 0x12:
      goto switchD_001436e7_caseD_12;
    case 0x13:
      goto switchD_001436e7_caseD_13;
    case 0x14:
      goto switchD_001436e7_caseD_14;
    case 0x15:
      goto switchD_001436e7_caseD_15;
    case 0x16:
      goto switchD_001436e7_caseD_16;
    case 0x17:
      goto switchD_001436e7_caseD_17;
    case 0x18:
      goto switchD_001436e7_caseD_18;
    case 0x19:
      goto switchD_001436e7_caseD_19;
    case 0x1a:
      goto switchD_001436e7_caseD_1a;
    case 0x1b:
      goto switchD_001436e7_caseD_1b;
    case 0x1c:
      goto switchD_001436e7_caseD_1c;
    case 0x1d:
      goto switchD_001436e7_caseD_1d;
    case 0x1e:
      goto switchD_001436e7_caseD_1e;
    case 0x1f:
      goto switchD_001436e7_caseD_1f;
    }
  }
  else {
    pbVar5 = (byte *)((long)input + (len - 0x20));
    lVar1 = seed + 0x60ea27eeadc0b5d6;
    lVar2 = seed + 0xc2b2ae3d27d4eb4f;
    lVar3 = seed + 0x61c8864e7a143579;
    do {
      uVar6 = *input * -0x3d4d51c2d82b14b1 + lVar1;
      uVar7 = uVar6 * 0x80000000 | uVar6 >> 0x21;
      lVar1 = uVar7 * -0x61c8864e7a143579;
      uVar9 = *(long *)((long)input + 8) * -0x3d4d51c2d82b14b1 + lVar2;
      uVar6 = uVar9 >> 0x21;
      uVar10 = uVar9 * 0x80000000 | uVar6;
      uVar9 = *(long *)((long)input + 0x10) * -0x3d4d51c2d82b14b1 + seed;
      uVar8 = uVar9 * 0x80000000 | uVar9 >> 0x21;
      lVar2 = uVar10 * -0x61c8864e7a143579;
      seed = uVar8 * -0x61c8864e7a143579;
      uVar9 = *(long *)((long)input + 0x18) * -0x3d4d51c2d82b14b1 + lVar3;
      uVar9 = uVar9 * 0x80000000 | uVar9 >> 0x21;
      input = (void *)((long)input + 0x20);
      lVar3 = uVar9 * -0x61c8864e7a143579;
    } while (input <= pbVar5);
    uVar7 = uVar7 * -0x210ca4fef0869357 >> 0x21 | uVar7 * -0x784349ab80000000;
    uVar4 = uVar7 * -0x61c8864e7a143579;
    uVar7 = (uVar10 * -0x210ca4fef0869357 >> 0x1f | uVar6 * 0x1ef2d95200000000) *
            -0x61c8864e7a143579 ^
            (uVar7 * 0x2a66d805bdebca87 + (uVar4 >> 0x25)) * -0x61c8864e7a143579 +
            0x85ebca77c2b2ae63;
    uVar6 = (uVar8 * -0x210ca4fef0869357 >> 0x23 | uVar8 * 0x21ef2d9520000000) * -0x61c8864e7a143579
            ^ uVar4 ^ ((uVar7 << 0x1b | uVar7 >> 0x25) + uVar7) * -0x61c8864e7a143579 +
                      0x85ebca77c2b2ae63;
    uVar9 = (uVar9 * -0x210ca4fef0869357 >> 0x25 | uVar9 * 0x87bcb6548000000) * -0x61c8864e7a143579
            ^ uVar7 ^ ((uVar6 << 0x1b | uVar6 >> 0x25) + uVar6) * -0x61c8864e7a143579 +
                      0x85ebca77c2b2ae63;
    uVar6 = ((uVar9 << 0x1b | uVar9 >> 0x25) + uVar9) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63 ^
            uVar6;
    switch((uint)len & 0x1f) {
    case 0:
      goto switchD_001436e7_caseD_0;
    case 0x1f:
switchD_001436e7_caseD_1f:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 0x1e) << 0x30;
    case 0x1e:
switchD_001436e7_caseD_1e:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 0x1d) << 0x28;
    case 0x1d:
switchD_001436e7_caseD_1d:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 0x1c) << 0x20;
    case 0x1c:
switchD_001436e7_caseD_1c:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 0x1b) << 0x18;
    case 0x1b:
switchD_001436e7_caseD_1b:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 0x1a) << 0x10;
    case 0x1a:
switchD_001436e7_caseD_1a:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 0x19) << 8;
    case 0x19:
switchD_001436e7_caseD_19:
      uVar9 = uVar9 ^ *(byte *)((long)input + 0x18);
      uVar6 = uVar6 ^ (uVar9 * -0x3d4d51c2d82b14b1 >> 0x35 | uVar9 * -0x6a8e16c158a58800) *
                      -0x61c8864e7a143579;
    case 0x18:
switchD_001436e7_caseD_18:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 0x17) << 0x38;
    case 0x17:
switchD_001436e7_caseD_17:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 0x16) << 0x30;
    case 0x16:
switchD_001436e7_caseD_16:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 0x15) << 0x28;
    case 0x15:
switchD_001436e7_caseD_15:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 0x14) << 0x20;
    case 0x14:
switchD_001436e7_caseD_14:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 0x13) << 0x18;
    case 0x13:
switchD_001436e7_caseD_13:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 0x12) << 0x10;
    case 0x12:
switchD_001436e7_caseD_12:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 0x11) << 8;
    case 0x11:
switchD_001436e7_caseD_11:
      uVar6 = uVar6 ^ *(byte *)((long)input + 0x10);
      uVar9 = uVar9 ^ (uVar6 * -0x3d4d51c2d82b14b1 >> 0x35 | uVar6 * -0x6a8e16c158a58800) *
                      -0x61c8864e7a143579;
    case 0x10:
switchD_001436e7_caseD_10:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 0xf) << 0x38;
    case 0xf:
switchD_001436e7_caseD_f:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 0xe) << 0x30;
    case 0xe:
switchD_001436e7_caseD_e:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 0xd) << 0x28;
    case 0xd:
switchD_001436e7_caseD_d:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 0xc) << 0x20;
    case 0xc:
switchD_001436e7_caseD_c:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 0xb) << 0x18;
    case 0xb:
switchD_001436e7_caseD_b:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 10) << 0x10;
    case 10:
switchD_001436e7_caseD_a:
      uVar9 = uVar9 ^ (ulong)*(byte *)((long)input + 9) << 8;
    case 9:
switchD_001436e7_caseD_9:
      uVar9 = uVar9 ^ *(byte *)((long)input + 8);
      uVar6 = uVar6 ^ (uVar9 * -0x3d4d51c2d82b14b1 >> 0x35 | uVar9 * -0x6a8e16c158a58800) *
                      -0x61c8864e7a143579;
    case 8:
switchD_001436e7_caseD_8:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 7) << 0x38;
    case 7:
switchD_001436e7_caseD_7:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 6) << 0x30;
    case 6:
switchD_001436e7_caseD_6:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 5) << 0x28;
    case 5:
switchD_001436e7_caseD_5:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 4) << 0x20;
    case 4:
switchD_001436e7_caseD_4:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 3) << 0x18;
    case 3:
switchD_001436e7_caseD_3:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 2) << 0x10;
    case 2:
switchD_001436e7_caseD_2:
      uVar6 = uVar6 ^ (ulong)*(byte *)((long)input + 1) << 8;
    }
  }
  uVar9 = uVar9 ^ ((*input ^ uVar6) * 0x27d4eb2f165667c5 >> 0x35 |
                  (*input ^ uVar6) * -0x58a6874d4cc1d800) * -0x61c8864e7a143579;
switchD_001436e7_caseD_0:
  uVar6 = len + 0x85ebca77c2b2ae63 + (uVar9 << 0x1b | uVar9 >> 0x25) * -0x61c8864e7a143579;
  uVar9 = (uVar6 >> 0x21 ^ uVar9 + len) * -0x3d4d51c2d82b14b1;
  uVar6 = (uVar9 >> 0x1d ^ uVar6) * 0x165667b19e3779f9;
  *(ulong *)out = uVar6;
  *(ulong *)((long)out + 8) = uVar6 >> 0x20 ^ uVar9;
  return;
}

Assistant:

void XXH128(const void *input, size_t len, unsigned long long seed, void *out) {
#if 0
    XXH128_state_t state;
    XXH128_reset(&state, seed);
    XXH128_update(&state, input, len);
    XXH128_digest(&state, out);
#else
    XXH_endianess endian_detected = (XXH_endianess) XXH_CPU_LITTLE_ENDIAN;

#  if !defined(XXH_USE_UNALIGNED_ACCESS)
    if ((((size_t)input) & 7)==0)   // Input is aligned, let's leverage the speed advantage
    {
        if ((endian_detected==XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
            XXH128_endian_align(input, len, seed, XXH_littleEndian, XXH_aligned, out);
        else
            XXH128_endian_align(input, len, seed, XXH_bigEndian, XXH_aligned, out);
    }
#  endif

    if ((endian_detected == XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        XXH128_endian_align(input, len, seed, XXH_littleEndian, XXH_unaligned, out);
    else
        XXH128_endian_align(input, len, seed, XXH_bigEndian, XXH_unaligned, out);
#endif
}